

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::MakeDirectory(string *path)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  string topdir;
  string dir;
  char *local_100;
  undefined8 local_f8;
  char local_f0;
  undefined7 uStack_ef;
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 local_c0 [144];
  
  if ((path->_M_string_length != 0) &&
     (iVar3 = lstat64((path->_M_dataplus)._M_p,(stat64 *)local_c0), iVar3 == 0)) {
    bVar2 = FileIsDirectory(path);
    return bVar2;
  }
  if (path->_M_string_length != 0) {
    local_c0._0_8_ = local_c0 + 0x10;
    pcVar1 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar1,pcVar1 + path->_M_string_length);
    ConvertToUnixSlashes((string *)local_c0);
    local_f8 = 0;
    local_f0 = '\0';
    local_100 = &local_f0;
    lVar4 = std::__cxx11::string::find((char)local_c0,0x2f);
    if (lVar4 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_e0,(ulong)local_c0);
        std::__cxx11::string::operator=((string *)&local_100,(string *)local_e0);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        mkdir(local_100,0x1ff);
        lVar4 = std::__cxx11::string::find((char)local_c0,0x2f);
      } while (lVar4 != -1);
    }
    std::__cxx11::string::_M_assign((string *)&local_100);
    iVar3 = mkdir(local_100,0x1ff);
    if ((iVar3 == 0) || (piVar5 = __errno_location(), *piVar5 == 0x11)) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
    }
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool SystemTools::MakeDirectory(const std::string& path)
{
  if (SystemTools::PathExists(path)) {
    return SystemTools::FileIsDirectory(path);
  }
  if (path.empty()) {
    return false;
  }
  std::string dir = path;
  SystemTools::ConvertToUnixSlashes(dir);

  std::string::size_type pos = 0;
  std::string topdir;
  while ((pos = dir.find('/', pos)) != std::string::npos) {
    topdir = dir.substr(0, pos);
    Mkdir(topdir);
    pos++;
  }
  topdir = dir;
  if (Mkdir(topdir) != 0) {
    // There is a bug in the Borland Run time library which makes MKDIR
    // return EACCES when it should return EEXISTS
    // if it is some other error besides directory exists
    // then return false
    if ((errno != EEXIST)
#ifdef __BORLANDC__
        && (errno != EACCES)
#endif
          ) {
      return false;
    }
  }
  return true;
}